

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::insert
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t index,utf32_t x,
          size_t count)

{
  C *pCVar1;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this_00;
  C *p;
  C *pattern_00;
  long in_RCX;
  utf32_t in_EDX;
  size_t in_RDI;
  C *dst;
  size_t insertLength;
  size_t codePointLength;
  C *end;
  C pattern [1];
  size_t oldLength;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  C local_34;
  size_t local_30;
  long local_28;
  size_t local_8;
  
  local_30 = *(size_t *)(in_RDI + 0x10);
  local_8 = local_30;
  if (in_RCX != 0) {
    local_28 = in_RCX;
    pCVar1 = enc::Utf32Encoder::encode(&local_34,in_EDX,0);
    this_00 = (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *)
              ((long)pCVar1 - (long)&local_34 >> 2);
    p = (C *)(local_28 * (long)this_00);
    pattern_00 = insertSpace(this_00,(size_t)p,in_stack_ffffffffffffffa8);
    if (pattern_00 == (C *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      fillWithPattern(p,pattern_00,in_RDI,in_stack_ffffffffffffff98);
      local_8 = local_30 + (long)p;
    }
  }
  return local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		utf32_t x,
		size_t count
	) {
		size_t oldLength = this->m_length;

		if (count == 0)
			return oldLength;

		C pattern[sizeof(utf32_t) / sizeof(C)];
		C* end = Encoding::Encoder::encode(pattern, x);
		size_t codePointLength = end - pattern;
		ASSERT(codePointLength <= countof(pattern));

		size_t insertLength = count * codePointLength;
		C* dst = insertSpace(index, count * codePointLength);
		if (!dst)
			return -1;

		fillWithPattern(dst, pattern, codePointLength, count);
		return oldLength + insertLength;
	}